

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O1

void test_bson_iter_overflow(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  bson_t *pbVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined8 uVar7;
  undefined1 *puVar8;
  char *pcVar9;
  bson_t *unaff_RBX;
  undefined1 *puVar10;
  undefined8 *puVar11;
  bson_t *pbVar12;
  bson_t *pbVar13;
  bson_t *pbVar14;
  TestSuite *suite;
  ulong uVar15;
  undefined1 *puVar16;
  bson_t *pbVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  bson_iter_t iter;
  undefined1 auStack_3198 [4104];
  bson_t *pbStack_2190;
  code *pcStack_2188;
  undefined8 uStack_2110;
  undefined1 uStack_2108;
  TestSuite aTStack_2100 [5];
  code *pcStack_2008;
  int *piStack_1f90;
  int iStack_1f88;
  undefined1 auStack_1f84 [4];
  undefined1 auStack_1f80 [232];
  bson_t *pbStack_1e98;
  undefined1 *puStack_1e90;
  code *pcStack_1e88;
  bson_t bStack_1e80;
  bson_t abStack_1e00 [2];
  undefined8 uStack_1cc8;
  char *pcStack_1cc0;
  bson_t *pbStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  bson_t *pbStack_1ca0;
  char *pcStack_1c98;
  char *pcStack_1c90;
  code *pcStack_1c88;
  undefined1 auStack_1c80 [128];
  undefined1 auStack_1c00 [232];
  undefined1 *puStack_1b18;
  undefined1 *puStack_1b10;
  code *pcStack_1b08;
  undefined1 auStack_1b00 [128];
  undefined1 auStack_1a80 [368];
  undefined1 *puStack_1910;
  code *pcStack_1908;
  undefined1 auStack_1900 [128];
  undefined1 auStack_1880 [128];
  undefined1 auStack_1800 [128];
  undefined1 auStack_1780 [368];
  undefined8 *puStack_1610;
  code *apcStack_1608 [13];
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined1 auStack_1590 [16];
  undefined8 auStack_1580 [14];
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined1 auStack_1500 [360];
  undefined1 *puStack_1398;
  undefined1 *puStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  undefined1 auStack_1300 [368];
  undefined1 *puStack_1190;
  code *pcStack_1188;
  undefined1 auStack_1180 [128];
  undefined1 auStack_1100 [368];
  undefined1 *puStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [128];
  undefined1 auStack_f00 [368];
  undefined1 *puStack_d90;
  code *pcStack_d88;
  undefined1 auStack_d80 [128];
  undefined1 auStack_d00 [368];
  undefined1 *puStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [128];
  undefined1 auStack_b00 [368];
  undefined1 *puStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [128];
  undefined1 auStack_900 [368];
  undefined8 uStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [224];
  undefined8 uStack_6a0;
  undefined1 *puStack_698;
  undefined8 uStack_690;
  code *pcStack_688;
  undefined1 auStack_680 [240];
  undefined1 *puStack_590;
  code *apcStack_588 [15];
  uint uStack_50c;
  uint *puStack_508;
  undefined1 auStack_500 [8];
  uint uStack_4f8;
  int iStack_4f4;
  uint uStack_4d8;
  bson_t *pbStack_3b0;
  code *pcStack_388;
  undefined1 auStack_380 [240];
  bson_t *pbStack_290;
  code *apcStack_288 [15];
  long lStack_210;
  long lStack_208;
  undefined1 auStack_200 [232];
  bson_t *pbStack_118;
  code *pcStack_108;
  undefined1 auStack_100 [240];
  
  pcStack_108 = (code *)0x12aace;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow1.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    pcStack_108 = (code *)0x12aadf;
    pbVar4 = get_bson(
                     "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/overflow2.bson"
                     );
    if (pbVar4 == (bson_t *)0x0) goto LAB_0012ab16;
    pcStack_108 = (code *)0x12aaf2;
    cVar1 = bson_iter_init(auStack_100,pbVar4);
    unaff_RBX = pbVar4;
    if (cVar1 == '\0') goto LAB_0012ab1b;
    pcStack_108 = (code *)0x12aafe;
    cVar1 = bson_iter_next(auStack_100);
    if (cVar1 == '\0') {
      pcStack_108 = (code *)0x12ab0a;
      bson_destroy(pbVar4);
      return;
    }
  }
  else {
    pcStack_108 = (code *)0x12ab16;
    test_bson_iter_overflow_cold_1();
LAB_0012ab16:
    pcStack_108 = (code *)0x12ab1b;
    test_bson_iter_overflow_cold_4();
LAB_0012ab1b:
    pcStack_108 = (code *)0x12ab20;
    test_bson_iter_overflow_cold_2();
  }
  pcStack_108 = test_bson_iter_timeval;
  test_bson_iter_overflow_cold_3();
  apcStack_288[0] = (code *)0x12ab43;
  pbStack_118 = unaff_RBX;
  pcStack_108 = (code *)&stack0xfffffffffffffff8;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/test26.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    apcStack_288[0] = (code *)0x12abac;
    test_bson_iter_timeval_cold_5();
LAB_0012abac:
    apcStack_288[0] = (code *)0x12abb1;
    test_bson_iter_timeval_cold_1();
LAB_0012abb1:
    apcStack_288[0] = (code *)0x12abb6;
    test_bson_iter_timeval_cold_2();
LAB_0012abb6:
    apcStack_288[0] = (code *)0x12abbb;
    test_bson_iter_timeval_cold_3();
  }
  else {
    apcStack_288[0] = (code *)0x12ab5b;
    cVar1 = bson_iter_init(auStack_200,pbVar4);
    unaff_RBX = pbVar4;
    if (cVar1 == '\0') goto LAB_0012abac;
    apcStack_288[0] = (code *)0x12ab6c;
    cVar1 = bson_iter_next(auStack_200);
    if (cVar1 == '\0') goto LAB_0012abb1;
    apcStack_288[0] = (code *)0x12ab85;
    bson_iter_timeval(auStack_200,&lStack_210);
    if (lStack_210 != 0x499602d2) goto LAB_0012abb6;
    if (lStack_208 == 0) {
      apcStack_288[0] = (code *)0x12ab9e;
      bson_destroy(pbVar4);
      return;
    }
  }
  apcStack_288[0] = test_bson_iter_trailing_null;
  test_bson_iter_timeval_cold_4();
  pcStack_388 = (code *)0x12abdc;
  pbStack_290 = unaff_RBX;
  apcStack_288[0] = (code *)&pcStack_108;
  pbVar4 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/trailingnull.bson"
                   );
  if (pbVar4 == (bson_t *)0x0) {
    pcStack_388 = (code *)0x12ac13;
    test_bson_iter_trailing_null_cold_3();
  }
  else {
    pcStack_388 = (code *)0x12abef;
    cVar1 = bson_iter_init(auStack_380,pbVar4);
    unaff_RBX = pbVar4;
    if (cVar1 != '\0') {
      pcStack_388 = (code *)0x12abfb;
      cVar1 = bson_iter_next(auStack_380);
      if (cVar1 == '\0') {
        pcStack_388 = (code *)0x12ac07;
        bson_destroy(pbVar4);
        return;
      }
      goto LAB_0012ac18;
    }
  }
  pcStack_388 = (code *)0x12ac18;
  test_bson_iter_trailing_null_cold_1();
LAB_0012ac18:
  pcStack_388 = test_bson_iter_fuzz;
  test_bson_iter_trailing_null_cold_2();
  puVar16 = (undefined1 *)0x0;
  uVar18 = 0xfff66;
  pbStack_3b0 = unaff_RBX;
  pcStack_388 = (code *)apcStack_288;
  do {
    apcStack_588[0] = (code *)0x12ac50;
    puVar5 = (undefined4 *)bson_malloc0(0x200);
    *puVar5 = 0x200;
    uVar15 = 0;
    do {
      apcStack_588[0] = (code *)0x12ac61;
      iVar2 = rand();
      *(int *)((long)puVar5 + uVar15 + 4) = iVar2;
      uVar15 = uVar15 + 4;
    } while (uVar15 < 0x1fc);
    apcStack_588[0] = (code *)0x12ac80;
    lVar6 = bson_new_from_data(puVar5,0x200);
    if (lVar6 != 0) {
      apcStack_588[0] = (code *)0x12ac97;
      cVar1 = bson_iter_init(auStack_500,lVar6);
      if (cVar1 == '\0') {
LAB_0012adbb:
        apcStack_588[0] = (code *)0x12adc0;
        test_bson_iter_fuzz_cold_1();
LAB_0012adc0:
        apcStack_588[0] = (code *)0x12adc5;
        test_bson_iter_fuzz_cold_8();
LAB_0012adc5:
        apcStack_588[0] = (code *)0x12adca;
        test_bson_iter_fuzz_cold_4();
LAB_0012adca:
        apcStack_588[0] = (code *)0x12adcf;
        test_bson_iter_fuzz_cold_5();
LAB_0012adcf:
        apcStack_588[0] = (code *)0x12add4;
        test_bson_iter_fuzz_cold_7();
LAB_0012add4:
        apcStack_588[0] = (code *)0x12add9;
        test_bson_iter_fuzz_cold_6();
LAB_0012add9:
        apcStack_588[0] = (code *)0x12adde;
        test_bson_iter_fuzz_cold_3();
LAB_0012adde:
        apcStack_588[0] = test_bson_iter_regex;
        test_bson_iter_fuzz_cold_9();
        pcStack_688 = (code *)0x12adf8;
        puStack_590 = auStack_500;
        apcStack_588[0] = (code *)&pcStack_388;
        uVar7 = bson_new();
        pcStack_688 = (code *)0x12ae1d;
        cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd","");
        if (cVar1 == '\0') {
          pcStack_688 = (code *)0x12aeb4;
          test_bson_iter_regex_cold_1();
LAB_0012aeb4:
          pcStack_688 = (code *)0x12aeb9;
          test_bson_iter_regex_cold_2();
LAB_0012aeb9:
          pcStack_688 = (code *)0x12aebe;
          test_bson_iter_regex_cold_3();
LAB_0012aebe:
          pcStack_688 = (code *)0x12aec3;
          test_bson_iter_regex_cold_4();
LAB_0012aec3:
          pcStack_688 = (code *)0x12aec8;
          test_bson_iter_regex_cold_5();
LAB_0012aec8:
          pcStack_688 = (code *)0x12aecd;
          test_bson_iter_regex_cold_6();
        }
        else {
          pcStack_688 = (code *)0x12ae43;
          cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd",0);
          if (cVar1 == '\0') goto LAB_0012aeb4;
          pcStack_688 = (code *)0x12ae69;
          cVar1 = bson_append_regex(uVar7,"foo",0xffffffff,"^abcd","ix");
          if (cVar1 == '\0') goto LAB_0012aeb9;
          pcStack_688 = (code *)0x12ae78;
          cVar1 = bson_iter_init(auStack_680,uVar7);
          if (cVar1 == '\0') goto LAB_0012aebe;
          pcStack_688 = (code *)0x12ae84;
          cVar1 = bson_iter_next(auStack_680);
          if (cVar1 == '\0') goto LAB_0012aec3;
          pcStack_688 = (code *)0x12ae90;
          cVar1 = bson_iter_next(auStack_680);
          if (cVar1 == '\0') goto LAB_0012aec8;
          pcStack_688 = (code *)0x12ae9c;
          cVar1 = bson_iter_next(auStack_680);
          if (cVar1 != '\0') {
            pcStack_688 = (code *)0x12aea8;
            bson_destroy(uVar7);
            return;
          }
        }
        pcStack_688 = test_bson_iter_next_after_finish;
        test_bson_iter_regex_cold_7();
        uStack_690 = 0xfff66;
        pcStack_788 = (code *)0x12aeeb;
        uStack_6a0 = uVar7;
        puStack_698 = puVar16;
        pcStack_688 = (code *)apcStack_588;
        uVar7 = bson_new();
        pcStack_788 = (code *)0x12af07;
        cVar1 = bson_append_int32(uVar7,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') goto LAB_0012af58;
        pcStack_788 = (code *)0x12af16;
        cVar1 = bson_iter_init(auStack_780,uVar7);
        if (cVar1 == '\0') goto LAB_0012af5d;
        pcStack_788 = (code *)0x12af22;
        cVar1 = bson_iter_next(auStack_780);
        if (cVar1 != '\0') {
          uVar18 = 1000;
          while( true ) {
            pcStack_788 = (code *)0x12af37;
            cVar1 = bson_iter_next(auStack_780);
            if (cVar1 != '\0') break;
            uVar3 = (int)uVar18 - 1;
            uVar18 = (ulong)uVar3;
            if (uVar3 == 0) {
              pcStack_788 = (code *)0x12af48;
              bson_destroy(uVar7);
              return;
            }
          }
          pcStack_788 = (code *)0x12af58;
          test_bson_iter_next_after_finish_cold_4();
          puVar16 = auStack_780;
LAB_0012af58:
          pcStack_788 = (code *)0x12af5d;
          test_bson_iter_next_after_finish_cold_1();
LAB_0012af5d:
          pcStack_788 = (code *)0x12af62;
          test_bson_iter_next_after_finish_cold_2();
        }
        pcStack_788 = test_bson_iter_find_case;
        test_bson_iter_next_after_finish_cold_3();
        pcStack_988 = (code *)0x12af87;
        uStack_790 = uVar7;
        pcStack_788 = (code *)&pcStack_688;
        bson_init(auStack_900);
        pcStack_988 = (code *)0x12afa8;
        cVar1 = bson_append_utf8(auStack_900,"key",0xffffffff,"value",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_988 = (code *)0x12b013;
          test_bson_iter_find_case_cold_1();
LAB_0012b013:
          pcStack_988 = (code *)0x12b018;
          test_bson_iter_find_case_cold_2();
LAB_0012b018:
          pcStack_988 = (code *)0x12b01d;
          test_bson_iter_find_case_cold_3();
LAB_0012b01d:
          pcStack_988 = (code *)0x12b022;
          test_bson_iter_find_case_cold_4();
        }
        else {
          pcStack_988 = (code *)0x12afbc;
          cVar1 = bson_iter_init(auStack_980,auStack_900);
          if (cVar1 == '\0') goto LAB_0012b013;
          pcStack_988 = (code *)0x12afcf;
          cVar1 = bson_iter_find_case(auStack_980,"KEY");
          if (cVar1 == '\0') goto LAB_0012b018;
          pcStack_988 = (code *)0x12afe3;
          cVar1 = bson_iter_init(auStack_980,auStack_900);
          if (cVar1 == '\0') goto LAB_0012b01d;
          pcStack_988 = (code *)0x12aff6;
          cVar1 = bson_iter_find(auStack_980,"KEY");
          if (cVar1 == '\0') {
            pcStack_988 = (code *)0x12b007;
            bson_destroy(auStack_900);
            return;
          }
        }
        pcStack_988 = test_bson_iter_as_double;
        test_bson_iter_find_case_cold_5();
        pcStack_b88 = (code *)0x12b047;
        puStack_990 = auStack_900;
        pcStack_988 = (code *)&pcStack_788;
        bson_init(auStack_b00);
        pcStack_b88 = (code *)0x12b063;
        cVar1 = bson_append_double(0x4093487e5c91d14e,auStack_b00,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_b88 = (code *)0x12b1c6;
          test_bson_iter_as_double_cold_1();
LAB_0012b1c6:
          pcStack_b88 = (code *)0x12b1cb;
          test_bson_iter_as_double_cold_2();
LAB_0012b1cb:
          pcStack_b88 = (code *)0x12b1d0;
          test_bson_iter_as_double_cold_3();
LAB_0012b1d0:
          pcStack_b88 = (code *)0x12b1d5;
          test_bson_iter_as_double_cold_4();
LAB_0012b1d5:
          pcStack_b88 = (code *)0x12b1da;
          test_bson_iter_as_double_cold_5();
LAB_0012b1da:
          pcStack_b88 = (code *)0x12b1df;
          test_bson_iter_as_double_cold_6();
LAB_0012b1df:
          pcStack_b88 = (code *)0x12b1e4;
          test_bson_iter_as_double_cold_7();
LAB_0012b1e4:
          pcStack_b88 = (code *)0x12b1e9;
          test_bson_iter_as_double_cold_8();
LAB_0012b1e9:
          pcStack_b88 = (code *)0x12b1ee;
          test_bson_iter_as_double_cold_9();
LAB_0012b1ee:
          pcStack_b88 = (code *)0x12b1f3;
          test_bson_iter_as_double_cold_10();
LAB_0012b1f3:
          pcStack_b88 = (code *)0x12b1f8;
          test_bson_iter_as_double_cold_11();
        }
        else {
          pcStack_b88 = (code *)0x12b082;
          cVar1 = bson_iter_init_find(auStack_b80,auStack_b00,"key");
          if (cVar1 == '\0') goto LAB_0012b1c6;
          pcStack_b88 = (code *)0x12b092;
          iVar2 = bson_iter_type(auStack_b80);
          if (iVar2 != 1) goto LAB_0012b1cb;
          pcStack_b88 = (code *)0x12b0a3;
          dVar19 = (double)bson_iter_as_double(auStack_b80);
          if ((dVar19 != 1234.1234) || (NAN(dVar19))) goto LAB_0012b1d0;
          pcStack_b88 = (code *)0x12b0c7;
          bson_destroy(auStack_b00);
          pcStack_b88 = (code *)0x12b0cf;
          bson_init(auStack_b00);
          pcStack_b88 = (code *)0x12b0e8;
          cVar1 = bson_append_int32(auStack_b00,"key",0xffffffff,0x4d2);
          if (cVar1 == '\0') goto LAB_0012b1d5;
          pcStack_b88 = (code *)0x12b107;
          cVar1 = bson_iter_init_find(auStack_b80,auStack_b00,"key");
          if (cVar1 == '\0') goto LAB_0012b1da;
          pcStack_b88 = (code *)0x12b117;
          iVar2 = bson_iter_type(auStack_b80);
          if (iVar2 != 0x10) goto LAB_0012b1df;
          pcStack_b88 = (code *)0x12b128;
          dVar19 = (double)bson_iter_as_double(auStack_b80);
          if ((dVar19 != 1234.0) || (NAN(dVar19))) goto LAB_0012b1e4;
          pcStack_b88 = (code *)0x12b14c;
          bson_destroy(auStack_b00);
          pcStack_b88 = (code *)0x12b154;
          bson_init(auStack_b00);
          pcStack_b88 = (code *)0x12b16d;
          cVar1 = bson_append_int64(auStack_b00,"key",0xffffffff,0x10e1);
          if (cVar1 == '\0') goto LAB_0012b1e9;
          pcStack_b88 = (code *)0x12b188;
          cVar1 = bson_iter_init_find(auStack_b80,auStack_b00,"key");
          if (cVar1 == '\0') goto LAB_0012b1ee;
          pcStack_b88 = (code *)0x12b194;
          iVar2 = bson_iter_type(auStack_b80);
          if (iVar2 != 0x12) goto LAB_0012b1f3;
          pcStack_b88 = (code *)0x12b1a1;
          dVar19 = (double)bson_iter_as_double(auStack_b80);
          if ((dVar19 == 4321.0) && (!NAN(dVar19))) {
            pcStack_b88 = (code *)0x12b1ba;
            bson_destroy(auStack_b00);
            return;
          }
        }
        pcStack_b88 = test_bson_iter_overwrite_int32;
        test_bson_iter_as_double_cold_12();
        puVar8 = auStack_d00;
        pcStack_d88 = (code *)0x12b21d;
        puStack_b90 = auStack_b00;
        pcStack_b88 = (code *)&pcStack_988;
        bson_init(puVar8);
        pcStack_d88 = (code *)0x12b236;
        cVar1 = bson_append_int32(puVar8,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_d88 = (code *)0x12b2c6;
          test_bson_iter_overwrite_int32_cold_1();
LAB_0012b2c6:
          pcStack_d88 = (code *)0x12b2cb;
          test_bson_iter_overwrite_int32_cold_2();
LAB_0012b2cb:
          pcStack_d88 = (code *)0x12b2d0;
          test_bson_iter_overwrite_int32_cold_3();
LAB_0012b2d0:
          pcStack_d88 = (code *)0x12b2d5;
          test_bson_iter_overwrite_int32_cold_4();
LAB_0012b2d5:
          pcStack_d88 = (code *)0x12b2da;
          test_bson_iter_overwrite_int32_cold_5();
        }
        else {
          pcStack_d88 = (code *)0x12b255;
          cVar1 = bson_iter_init_find(auStack_d80,auStack_d00,"key");
          if (cVar1 == '\0') goto LAB_0012b2c6;
          pcStack_d88 = (code *)0x12b261;
          iVar2 = bson_iter_type(auStack_d80);
          if (iVar2 != 0x10) goto LAB_0012b2cb;
          pcStack_d88 = (code *)0x12b276;
          bson_iter_overwrite_int32(auStack_d80,0x10e1);
          pcStack_d88 = (code *)0x12b28d;
          cVar1 = bson_iter_init_find(auStack_d80,auStack_d00,"key");
          puVar8 = auStack_d80;
          if (cVar1 == '\0') goto LAB_0012b2d0;
          pcStack_d88 = (code *)0x12b299;
          iVar2 = bson_iter_type(auStack_d80);
          puVar8 = auStack_d80;
          if (iVar2 != 0x10) goto LAB_0012b2d5;
          pcStack_d88 = (code *)0x12b2a6;
          iVar2 = bson_iter_int32(auStack_d80);
          puVar8 = auStack_d80;
          if (iVar2 == 0x10e1) {
            pcStack_d88 = (code *)0x12b2ba;
            bson_destroy(auStack_d00);
            return;
          }
        }
        pcStack_d88 = test_bson_iter_overwrite_int64;
        test_bson_iter_overwrite_int32_cold_6();
        puVar10 = auStack_f00;
        pcStack_f88 = (code *)0x12b2ff;
        puStack_d90 = puVar8;
        pcStack_d88 = (code *)&pcStack_b88;
        bson_init(puVar10);
        pcStack_f88 = (code *)0x12b318;
        cVar1 = bson_append_int64(puVar10,"key",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_f88 = (code *)0x12b3a9;
          test_bson_iter_overwrite_int64_cold_1();
LAB_0012b3a9:
          pcStack_f88 = (code *)0x12b3ae;
          test_bson_iter_overwrite_int64_cold_2();
LAB_0012b3ae:
          pcStack_f88 = (code *)0x12b3b3;
          test_bson_iter_overwrite_int64_cold_3();
LAB_0012b3b3:
          pcStack_f88 = (code *)0x12b3b8;
          test_bson_iter_overwrite_int64_cold_4();
LAB_0012b3b8:
          pcStack_f88 = (code *)0x12b3bd;
          test_bson_iter_overwrite_int64_cold_5();
        }
        else {
          pcStack_f88 = (code *)0x12b337;
          cVar1 = bson_iter_init_find(auStack_f80,auStack_f00,"key");
          if (cVar1 == '\0') goto LAB_0012b3a9;
          pcStack_f88 = (code *)0x12b343;
          iVar2 = bson_iter_type(auStack_f80);
          if (iVar2 != 0x12) goto LAB_0012b3ae;
          pcStack_f88 = (code *)0x12b358;
          bson_iter_overwrite_int64(auStack_f80,0x1221);
          pcStack_f88 = (code *)0x12b36f;
          cVar1 = bson_iter_init_find(auStack_f80,auStack_f00,"key");
          puVar10 = auStack_f80;
          if (cVar1 == '\0') goto LAB_0012b3b3;
          pcStack_f88 = (code *)0x12b37b;
          iVar2 = bson_iter_type(auStack_f80);
          puVar10 = auStack_f80;
          if (iVar2 != 0x12) goto LAB_0012b3b8;
          pcStack_f88 = (code *)0x12b388;
          lVar6 = bson_iter_int64(auStack_f80);
          puVar10 = auStack_f80;
          if (lVar6 == 0x1221) {
            pcStack_f88 = (code *)0x12b39d;
            bson_destroy(auStack_f00);
            return;
          }
        }
        pcStack_f88 = test_bson_iter_overwrite_double;
        test_bson_iter_overwrite_int64_cold_6();
        puVar8 = auStack_1100;
        pcStack_1188 = (code *)0x12b3e2;
        puStack_f90 = puVar10;
        pcStack_f88 = (code *)&pcStack_d88;
        bson_init(puVar8);
        pcStack_1188 = (code *)0x12b3fe;
        cVar1 = bson_append_double(0x4093487e5c91d14e,puVar8,"key",0xffffffff);
        if (cVar1 == '\0') {
          pcStack_1188 = (code *)0x12b496;
          test_bson_iter_overwrite_double_cold_1();
LAB_0012b496:
          pcStack_1188 = (code *)0x12b49b;
          test_bson_iter_overwrite_double_cold_2();
LAB_0012b49b:
          pcStack_1188 = (code *)0x12b4a0;
          test_bson_iter_overwrite_double_cold_3();
LAB_0012b4a0:
          pcStack_1188 = (code *)0x12b4a5;
          test_bson_iter_overwrite_double_cold_4();
LAB_0012b4a5:
          pcStack_1188 = (code *)0x12b4aa;
          test_bson_iter_overwrite_double_cold_5();
        }
        else {
          pcStack_1188 = (code *)0x12b41d;
          cVar1 = bson_iter_init_find(auStack_1180,auStack_1100,"key");
          if (cVar1 == '\0') goto LAB_0012b496;
          pcStack_1188 = (code *)0x12b429;
          iVar2 = bson_iter_type(auStack_1180);
          if (iVar2 != 1) goto LAB_0012b49b;
          pcStack_1188 = (code *)0x12b441;
          bson_iter_overwrite_double(0x40b2211f97247454,auStack_1180);
          pcStack_1188 = (code *)0x12b458;
          cVar1 = bson_iter_init_find(auStack_1180,auStack_1100,"key");
          puVar8 = auStack_1180;
          if (cVar1 == '\0') goto LAB_0012b4a0;
          pcStack_1188 = (code *)0x12b464;
          iVar2 = bson_iter_type(auStack_1180);
          puVar8 = auStack_1180;
          if (iVar2 != 1) goto LAB_0012b4a5;
          pcStack_1188 = (code *)0x12b471;
          dVar19 = (double)bson_iter_double(auStack_1180);
          puVar8 = auStack_1180;
          if ((dVar19 == 4641.1234) && (puVar8 = auStack_1180, !NAN(dVar19))) {
            pcStack_1188 = (code *)0x12b48a;
            bson_destroy(auStack_1100);
            return;
          }
        }
        pcStack_1188 = test_bson_iter_overwrite_bool;
        test_bson_iter_overwrite_double_cold_6();
        puVar10 = auStack_1300;
        pcStack_1388 = (code *)0x12b4cf;
        puStack_1190 = puVar8;
        pcStack_1188 = (code *)&pcStack_f88;
        bson_init(puVar10);
        pcStack_1388 = (code *)0x12b4e8;
        cVar1 = bson_append_bool(puVar10,"key",0xffffffff,1);
        if (cVar1 == '\0') {
          pcStack_1388 = (code *)0x12b56e;
          test_bson_iter_overwrite_bool_cold_1();
LAB_0012b56e:
          pcStack_1388 = (code *)0x12b573;
          test_bson_iter_overwrite_bool_cold_2();
LAB_0012b573:
          pcStack_1388 = (code *)0x12b578;
          test_bson_iter_overwrite_bool_cold_3();
LAB_0012b578:
          pcStack_1388 = (code *)0x12b57d;
          test_bson_iter_overwrite_bool_cold_4();
LAB_0012b57d:
          pcStack_1388 = (code *)0x12b582;
          test_bson_iter_overwrite_bool_cold_5();
        }
        else {
          pcStack_1388 = (code *)0x12b503;
          cVar1 = bson_iter_init_find(auStack_1380,auStack_1300,"key");
          if (cVar1 == '\0') goto LAB_0012b56e;
          pcStack_1388 = (code *)0x12b50f;
          iVar2 = bson_iter_type(auStack_1380);
          if (iVar2 != 8) goto LAB_0012b573;
          pcStack_1388 = (code *)0x12b521;
          bson_iter_overwrite_bool(auStack_1380,0);
          pcStack_1388 = (code *)0x12b538;
          cVar1 = bson_iter_init_find(auStack_1380,auStack_1300,"key");
          puVar10 = auStack_1380;
          if (cVar1 == '\0') goto LAB_0012b578;
          pcStack_1388 = (code *)0x12b544;
          iVar2 = bson_iter_type(auStack_1380);
          puVar10 = auStack_1380;
          if (iVar2 != 8) goto LAB_0012b57d;
          pcStack_1388 = (code *)0x12b551;
          cVar1 = bson_iter_bool(auStack_1380);
          puVar10 = auStack_1380;
          if (cVar1 == '\0') {
            pcStack_1388 = (code *)0x12b562;
            bson_destroy(auStack_1300);
            return;
          }
        }
        pcStack_1388 = test_bson_iter_overwrite_decimal128;
        test_bson_iter_overwrite_bool_cold_6();
        puVar11 = &uStack_1510;
        uStack_1508 = 0;
        uStack_1510 = 1;
        uStack_1598 = 0;
        uStack_15a0 = 2;
        puVar8 = auStack_1500;
        apcStack_1608[0] = (code *)0x12b5cc;
        puStack_1398 = puVar10;
        puStack_1390 = puVar16;
        pcStack_1388 = (code *)&pcStack_1188;
        bson_init(puVar8);
        apcStack_1608[0] = (code *)0x12b5e3;
        cVar1 = bson_append_decimal128(puVar8,"key",0xffffffff,puVar11);
        if (cVar1 == '\0') {
          apcStack_1608[0] = (code *)0x12b6b3;
          test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b6b3:
          apcStack_1608[0] = (code *)0x12b6b8;
          test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b6b8:
          apcStack_1608[0] = (code *)0x12b6bd;
          test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b6bd:
          apcStack_1608[0] = (code *)0x12b6c2;
          test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b6c2:
          apcStack_1608[0] = (code *)0x12b6c7;
          test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b6c7:
          apcStack_1608[0] = (code *)0x12b6cc;
          test_bson_iter_overwrite_decimal128_cold_6();
        }
        else {
          apcStack_1608[0] = (code *)0x12b607;
          cVar1 = bson_iter_init_find(auStack_1580,auStack_1500,"key");
          if (cVar1 == '\0') goto LAB_0012b6b3;
          apcStack_1608[0] = (code *)0x12b61c;
          iVar2 = bson_iter_type(auStack_1580);
          if (iVar2 != 0x13) goto LAB_0012b6b8;
          puVar11 = auStack_1580;
          apcStack_1608[0] = (code *)0x12b63a;
          bson_iter_overwrite_decimal128(puVar11,&uStack_15a0);
          apcStack_1608[0] = (code *)0x12b651;
          cVar1 = bson_iter_init_find(puVar11,auStack_1500,"key");
          if (cVar1 == '\0') goto LAB_0012b6bd;
          apcStack_1608[0] = (code *)0x12b662;
          iVar2 = bson_iter_type(auStack_1580);
          if (iVar2 != 0x13) goto LAB_0012b6c2;
          apcStack_1608[0] = (code *)0x12b679;
          cVar1 = bson_iter_decimal128(auStack_1580,auStack_1590);
          if (cVar1 == '\0') goto LAB_0012b6c7;
          auVar20[0] = -((char)uStack_15a0 == auStack_1590[0]);
          auVar20[1] = -(uStack_15a0._1_1_ == auStack_1590[1]);
          auVar20[2] = -(uStack_15a0._2_1_ == auStack_1590[2]);
          auVar20[3] = -(uStack_15a0._3_1_ == auStack_1590[3]);
          auVar20[4] = -(uStack_15a0._4_1_ == auStack_1590[4]);
          auVar20[5] = -(uStack_15a0._5_1_ == auStack_1590[5]);
          auVar20[6] = -(uStack_15a0._6_1_ == auStack_1590[6]);
          auVar20[7] = -(uStack_15a0._7_1_ == auStack_1590[7]);
          auVar20[8] = -((char)uStack_1598 == auStack_1590[8]);
          auVar20[9] = -(uStack_1598._1_1_ == auStack_1590[9]);
          auVar20[10] = -(uStack_1598._2_1_ == auStack_1590[10]);
          auVar20[0xb] = -(uStack_1598._3_1_ == auStack_1590[0xb]);
          auVar20[0xc] = -(uStack_1598._4_1_ == auStack_1590[0xc]);
          auVar20[0xd] = -(uStack_1598._5_1_ == auStack_1590[0xd]);
          auVar20[0xe] = -(uStack_1598._6_1_ == auStack_1590[0xe]);
          auVar20[0xf] = -(uStack_1598._7_1_ == auStack_1590[0xf]);
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
            apcStack_1608[0] = (code *)0x12b6a5;
            bson_destroy(auStack_1500);
            return;
          }
        }
        apcStack_1608[0] = test_bson_iter_recurse;
        test_bson_iter_overwrite_decimal128_cold_7();
        pcStack_1908 = (code *)0x12b6ee;
        puStack_1610 = puVar11;
        apcStack_1608[0] = (code *)&pcStack_1388;
        bson_init(auStack_1780);
        pcStack_1908 = (code *)0x12b6fe;
        bson_init(auStack_1880);
        pcStack_1908 = (code *)0x12b714;
        cVar1 = bson_append_int32(auStack_1880,"0",1,0);
        if (cVar1 == '\0') {
          pcStack_1908 = (code *)0x12b84e;
          test_bson_iter_recurse_cold_1();
LAB_0012b84e:
          pcStack_1908 = (code *)0x12b853;
          test_bson_iter_recurse_cold_2();
LAB_0012b853:
          pcStack_1908 = (code *)0x12b858;
          test_bson_iter_recurse_cold_3();
LAB_0012b858:
          pcStack_1908 = (code *)0x12b85d;
          test_bson_iter_recurse_cold_4();
LAB_0012b85d:
          pcStack_1908 = (code *)0x12b862;
          test_bson_iter_recurse_cold_5();
LAB_0012b862:
          pcStack_1908 = (code *)0x12b867;
          test_bson_iter_recurse_cold_6();
LAB_0012b867:
          pcStack_1908 = (code *)0x12b86c;
          test_bson_iter_recurse_cold_7();
LAB_0012b86c:
          pcStack_1908 = (code *)0x12b871;
          test_bson_iter_recurse_cold_8();
LAB_0012b871:
          pcStack_1908 = (code *)0x12b876;
          test_bson_iter_recurse_cold_9();
LAB_0012b876:
          pcStack_1908 = (code *)0x12b87b;
          test_bson_iter_recurse_cold_10();
        }
        else {
          pcStack_1908 = (code *)0x12b73a;
          cVar1 = bson_append_int32(auStack_1880,"1",1,1);
          if (cVar1 == '\0') goto LAB_0012b84e;
          pcStack_1908 = (code *)0x12b760;
          cVar1 = bson_append_int32(auStack_1880,"2",1,2);
          if (cVar1 == '\0') goto LAB_0012b853;
          pcStack_1908 = (code *)0x12b789;
          cVar1 = bson_append_array(auStack_1780,"key",0xffffffff,auStack_1880);
          if (cVar1 == '\0') goto LAB_0012b858;
          pcStack_1908 = (code *)0x12b7ad;
          cVar1 = bson_iter_init_find(auStack_1800,auStack_1780,"key");
          if (cVar1 == '\0') goto LAB_0012b85d;
          pcStack_1908 = (code *)0x12b7c2;
          iVar2 = bson_iter_type(auStack_1800);
          if (iVar2 != 4) goto LAB_0012b862;
          pcStack_1908 = (code *)0x12b7db;
          cVar1 = bson_iter_recurse(auStack_1800,auStack_1900);
          if (cVar1 == '\0') goto LAB_0012b867;
          pcStack_1908 = (code *)0x12b7f2;
          cVar1 = bson_iter_find(auStack_1900,"0");
          if (cVar1 == '\0') goto LAB_0012b86c;
          pcStack_1908 = (code *)0x12b805;
          cVar1 = bson_iter_find(auStack_1900,"1");
          if (cVar1 == '\0') goto LAB_0012b871;
          pcStack_1908 = (code *)0x12b818;
          cVar1 = bson_iter_find(auStack_1900,"2");
          if (cVar1 == '\0') goto LAB_0012b876;
          pcStack_1908 = (code *)0x12b824;
          cVar1 = bson_iter_next(auStack_1900);
          if (cVar1 == '\0') {
            pcStack_1908 = (code *)0x12b835;
            bson_destroy(auStack_1780);
            pcStack_1908 = (code *)0x12b842;
            bson_destroy(auStack_1880);
            return;
          }
        }
        pcStack_1908 = test_bson_iter_init_find_case;
        test_bson_iter_recurse_cold_11();
        pcStack_1b08 = (code *)0x12b8a0;
        puStack_1910 = auStack_1880;
        pcStack_1908 = (code *)apcStack_1608;
        bson_init(auStack_1a80);
        pcStack_1b08 = (code *)0x12b8b9;
        cVar1 = bson_append_int32(auStack_1a80,"FOO",0xffffffff,0x4d2);
        if (cVar1 == '\0') {
          pcStack_1b08 = (code *)0x12b900;
          test_bson_iter_init_find_case_cold_1();
LAB_0012b900:
          pcStack_1b08 = (code *)0x12b905;
          test_bson_iter_init_find_case_cold_2();
        }
        else {
          pcStack_1b08 = (code *)0x12b8d4;
          cVar1 = bson_iter_init_find_case(auStack_1b00,auStack_1a80,"foo");
          if (cVar1 == '\0') goto LAB_0012b900;
          pcStack_1b08 = (code *)0x12b8e0;
          iVar2 = bson_iter_int32(auStack_1b00);
          if (iVar2 == 0x4d2) {
            pcStack_1b08 = (code *)0x12b8f4;
            bson_destroy(auStack_1a80);
            return;
          }
        }
        pcStack_1b08 = test_bson_iter_find_descendant;
        test_bson_iter_init_find_case_cold_3();
        pcStack_1c88 = (code *)0x12b928;
        puStack_1b18 = auStack_1a80;
        puStack_1b10 = puVar8;
        pcStack_1b08 = (code *)&pcStack_1908;
        pbVar4 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                         );
        pcStack_1c88 = (code *)0x12b93b;
        cVar1 = bson_iter_init(auStack_1c00,pbVar4);
        if (cVar1 == '\0') {
          pcStack_1c88 = (code *)0x12bb6c;
          test_bson_iter_find_descendant_cold_1();
LAB_0012bb6c:
          pcStack_1c88 = (code *)0x12bb71;
          test_bson_iter_find_descendant_cold_2();
LAB_0012bb71:
          pcStack_1c88 = (code *)0x12bb76;
          test_bson_iter_find_descendant_cold_3();
LAB_0012bb76:
          pcStack_1c88 = (code *)0x12bb7b;
          test_bson_iter_find_descendant_cold_4();
LAB_0012bb7b:
          pcStack_1c88 = (code *)0x12bb80;
          test_bson_iter_find_descendant_cold_5();
LAB_0012bb80:
          pcStack_1c88 = (code *)0x12bb85;
          test_bson_iter_find_descendant_cold_6();
LAB_0012bb85:
          pcStack_1c88 = (code *)0x12bb8a;
          test_bson_iter_find_descendant_cold_7();
LAB_0012bb8a:
          pcStack_1c88 = (code *)0x12bb8f;
          test_bson_iter_find_descendant_cold_8();
LAB_0012bb8f:
          pcStack_1c88 = (code *)0x12bb94;
          test_bson_iter_find_descendant_cold_9();
LAB_0012bb94:
          pcStack_1c88 = (code *)0x12bb99;
          test_bson_iter_find_descendant_cold_10();
LAB_0012bb99:
          pcStack_1c88 = (code *)0x12bb9e;
          test_bson_iter_find_descendant_cold_11();
LAB_0012bb9e:
          pcStack_1c88 = (code *)0x12bba3;
          test_bson_iter_find_descendant_cold_12();
LAB_0012bba3:
          pcStack_1c88 = (code *)0x12bba8;
          test_bson_iter_find_descendant_cold_13();
        }
        else {
          pcStack_1c88 = (code *)0x12b95a;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"a.b.c.0",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bb6c;
          pcStack_1c88 = (code *)0x12b96a;
          iVar2 = bson_iter_type(auStack_1c80);
          if (iVar2 != 0x10) goto LAB_0012bb71;
          pcStack_1c88 = (code *)0x12b97b;
          iVar2 = bson_iter_int32(auStack_1c80);
          if (iVar2 != 1) goto LAB_0012bb76;
          pcStack_1c88 = (code *)0x12b98c;
          bson_destroy(pbVar4);
          pcStack_1c88 = (code *)0x12b991;
          pbVar4 = (bson_t *)bson_bcon_magic();
          pcStack_1c88 = (code *)0x0;
          pcStack_1c90 = "}";
          pcStack_1c98 = "]";
          pbStack_1ca0 = (bson_t *)0x148ce7;
          uStack_1ca8 = 1;
          uStack_1cb0 = 0xf;
          pcStack_1cc0 = "baz";
          uStack_1cc8 = 0x12b9e0;
          pbStack_1cb8 = pbVar4;
          puVar8 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
          pcStack_1c88 = (code *)0x12b9f7;
          cVar1 = bson_iter_init(auStack_1c00,puVar8);
          if (cVar1 == '\0') goto LAB_0012bb7b;
          pcStack_1c88 = (code *)0x12ba16;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"foo.bar.0.baz",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bb80;
          pcStack_1c88 = (code *)0x12ba26;
          iVar2 = bson_iter_type(auStack_1c80);
          if (iVar2 != 0x10) goto LAB_0012bb85;
          pcStack_1c88 = (code *)0x12ba37;
          iVar2 = bson_iter_int32(auStack_1c80);
          if (iVar2 != 1) goto LAB_0012bb8a;
          pcStack_1c88 = (code *)0x12ba48;
          bson_destroy(puVar8);
          pcStack_1c88 = (code *)0x0;
          pcStack_1c90 = (char *)0x2;
          pcStack_1c98 = (char *)0xf;
          uStack_1ca8 = 0x12ba74;
          pbStack_1ca0 = pbVar4;
          puVar8 = (undefined1 *)bcon_new(0,"nModified",pbVar4,0xf,1,"n");
          pcStack_1c88 = (code *)0x12ba8b;
          cVar1 = bson_iter_init(auStack_1c00,puVar8);
          if (cVar1 == '\0') goto LAB_0012bb8f;
          pcStack_1c88 = (code *)0x12baaa;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"n",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bb94;
          pcStack_1c88 = (code *)0x12baba;
          pcVar9 = (char *)bson_iter_key(auStack_1c80);
          pcStack_1c88 = (code *)0x12bac9;
          iVar2 = strcmp(pcVar9,"n");
          if (iVar2 != 0) goto LAB_0012bb99;
          pcStack_1c88 = (code *)0x12bad9;
          bson_destroy(puVar8);
          pcStack_1c88 = (code *)0x0;
          pcStack_1c90 = (char *)0x2;
          pcStack_1c98 = (char *)0xf;
          uStack_1ca8 = 0x12bb05;
          pbStack_1ca0 = pbVar4;
          pbVar4 = (bson_t *)bcon_new(0,"",pbVar4,0xf,1,"n");
          pcStack_1c88 = (code *)0x12bb1c;
          cVar1 = bson_iter_init(auStack_1c00,pbVar4);
          if (cVar1 == '\0') goto LAB_0012bb9e;
          pcStack_1c88 = (code *)0x12bb37;
          cVar1 = bson_iter_find_descendant(auStack_1c00,"n",auStack_1c80);
          if (cVar1 == '\0') goto LAB_0012bba3;
          pcStack_1c88 = (code *)0x12bb43;
          pcVar9 = (char *)bson_iter_key(auStack_1c80);
          pcStack_1c88 = (code *)0x12bb52;
          iVar2 = strcmp(pcVar9,"n");
          if (iVar2 == 0) {
            pcStack_1c88 = (code *)0x12bb5e;
            bson_destroy(pbVar4);
            return;
          }
        }
        pcStack_1c88 = test_bson_iter_as_bool;
        test_bson_iter_find_descendant_cold_14();
        pbVar13 = &bStack_1e80;
        pbVar14 = &bStack_1e80;
        pbVar17 = &bStack_1e80;
        pbVar12 = abStack_1e00;
        pcStack_1e88 = (code *)0x12bbd1;
        pbStack_1ca0 = pbVar4;
        pcStack_1c98 = puVar8;
        pcStack_1c90 = (char *)uVar18;
        pcStack_1c88 = (code *)&pcStack_1b08;
        bson_init(pbVar12);
        pcStack_1e88 = (code *)0x12bbea;
        bson_append_int32(pbVar12,"int32[true]",0xffffffff,1);
        pcStack_1e88 = (code *)0x12bc00;
        bson_append_int32(pbVar12,"int32[false]",0xffffffff,0);
        pcStack_1e88 = (code *)0x12bc1c;
        bson_append_int64(pbVar12,"int64[true]",0xffffffff,1);
        pcStack_1e88 = (code *)0x12bc35;
        bson_append_int64(pbVar12,"int64[false]",0xffffffff,0);
        pcStack_1e88 = (code *)0x12bc4d;
        bson_append_double(0x3ff0000000000000,pbVar12,"int64[true]",0xffffffff);
        pcStack_1e88 = (code *)0x12bc60;
        bson_append_double(pbVar12,"int64[false]",0xffffffff);
        pcStack_1e88 = (code *)0x12bc6e;
        bson_iter_init(&bStack_1e80,pbVar12);
        pcStack_1e88 = (code *)0x12bc76;
        bson_iter_next(&bStack_1e80);
        pcStack_1e88 = (code *)0x12bc7e;
        cVar1 = bson_iter_as_bool(&bStack_1e80);
        if (cVar1 == '\0') {
          pcStack_1e88 = (code *)0x12bd16;
          test_bson_iter_as_bool_cold_1();
LAB_0012bd16:
          pcStack_1e88 = (code *)0x12bd1b;
          test_bson_iter_as_bool_cold_6();
LAB_0012bd1b:
          pbVar13 = pbVar12;
          pcStack_1e88 = (code *)0x12bd20;
          test_bson_iter_as_bool_cold_2();
LAB_0012bd20:
          pcStack_1e88 = (code *)0x12bd25;
          test_bson_iter_as_bool_cold_5();
LAB_0012bd25:
          pbVar14 = pbVar13;
          pcStack_1e88 = (code *)0x12bd2a;
          test_bson_iter_as_bool_cold_3();
        }
        else {
          pcStack_1e88 = (code *)0x12bc91;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bc99;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          pbVar12 = &bStack_1e80;
          if (cVar1 != '\0') goto LAB_0012bd16;
          pcStack_1e88 = (code *)0x12bca8;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bcb0;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          pbVar12 = &bStack_1e80;
          if (cVar1 == '\0') goto LAB_0012bd1b;
          pcStack_1e88 = (code *)0x12bcbf;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bcc7;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          if (cVar1 != '\0') goto LAB_0012bd20;
          pcStack_1e88 = (code *)0x12bcd6;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bcde;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          pbVar13 = &bStack_1e80;
          if (cVar1 == '\0') goto LAB_0012bd25;
          pcStack_1e88 = (code *)0x12bced;
          bson_iter_next(&bStack_1e80);
          pcStack_1e88 = (code *)0x12bcf5;
          cVar1 = bson_iter_as_bool(&bStack_1e80);
          if (cVar1 == '\0') {
            pcStack_1e88 = (code *)0x12bd06;
            bson_destroy(abStack_1e00);
            return;
          }
        }
        pcStack_1e88 = test_bson_iter_binary_deprecated;
        test_bson_iter_as_bool_cold_4();
        pcStack_2008 = (code *)0x12bd4d;
        pbStack_1e98 = pbVar14;
        puStack_1e90 = (undefined1 *)&bStack_1e80;
        pcStack_1e88 = (code *)&pcStack_1c88;
        pbVar4 = get_bson(
                         "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                         );
        if (pbVar4 == (bson_t *)0x0) {
          pcStack_2008 = (code *)0x12bdc2;
          test_bson_iter_binary_deprecated_cold_5();
LAB_0012bdc2:
          pcStack_2008 = (code *)0x12bdc7;
          test_bson_iter_binary_deprecated_cold_1();
LAB_0012bdc7:
          pcStack_2008 = (code *)0x12bdcc;
          test_bson_iter_binary_deprecated_cold_2();
LAB_0012bdcc:
          pcStack_2008 = (code *)0x12bdd1;
          test_bson_iter_binary_deprecated_cold_3();
        }
        else {
          pcStack_2008 = (code *)0x12bd65;
          cVar1 = bson_iter_init(auStack_1f80,pbVar4);
          pbVar14 = pbVar4;
          if (cVar1 == '\0') goto LAB_0012bdc2;
          pcStack_2008 = (code *)0x12bd76;
          cVar1 = bson_iter_next(auStack_1f80);
          if (cVar1 == '\0') goto LAB_0012bdc7;
          pbVar17 = (bson_t *)&iStack_1f88;
          pcStack_2008 = (code *)0x12bd99;
          bson_iter_binary(auStack_1f80,auStack_1f84,pbVar17,&piStack_1f90);
          if (iStack_1f88 != 4) goto LAB_0012bdcc;
          if (*piStack_1f90 == 0x34333231) {
            pcStack_2008 = (code *)0x12bdb4;
            bson_destroy(pbVar4);
            return;
          }
        }
        pcStack_2008 = test_bson_iter_from_data;
        test_bson_iter_binary_deprecated_cold_4();
        uStack_2110 = 0x100620800000009;
        uStack_2108 = 0;
        suite = aTStack_2100;
        pcStack_2188 = (code *)0x12be0d;
        pcStack_2008 = (code *)&pcStack_1e88;
        cVar1 = bson_iter_init_from_data(suite,&uStack_2110,9);
        if (cVar1 == '\0') {
          pcStack_2188 = (code *)0x12be4f;
          test_bson_iter_from_data_cold_1();
LAB_0012be4f:
          pcStack_2188 = (code *)0x12be54;
          test_bson_iter_from_data_cold_2();
LAB_0012be54:
          pcStack_2188 = (code *)0x12be59;
          test_bson_iter_from_data_cold_3();
        }
        else {
          suite = aTStack_2100;
          pcStack_2188 = (code *)0x12be1e;
          cVar1 = bson_iter_next();
          if (cVar1 == '\0') goto LAB_0012be4f;
          suite = aTStack_2100;
          pcStack_2188 = (code *)0x12be2f;
          iVar2 = bson_iter_type();
          if (iVar2 != 8) goto LAB_0012be54;
          suite = aTStack_2100;
          pcStack_2188 = (code *)0x12be41;
          cVar1 = bson_iter_bool();
          if (cVar1 != '\0') {
            return;
          }
        }
        pcStack_2188 = get_bson;
        test_bson_iter_from_data_cold_4();
        pbStack_2190 = pbVar14;
        pcStack_2188 = (code *)pbVar17;
        iVar2 = open((char *)suite,0);
        if (iVar2 != -1) {
          uVar18 = read(iVar2,auStack_3198,0x1000);
          if ((long)uVar18 < 0) goto LAB_0012bec0;
          if (uVar18 != 0) {
            bson_new_from_data(auStack_3198,uVar18 & 0xffffffff);
            close(iVar2);
            return;
          }
          get_bson_cold_1();
        }
        get_bson_cold_3();
LAB_0012bec0:
        get_bson_cold_2();
        TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
        TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
        TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
        TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
        TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
        TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
        TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
        TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
        TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
        TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
        TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
        TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
        TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                      test_bson_as_canonical_extended_json_dbpointer);
        TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
        TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
        TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
        TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
        TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
        TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
        TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
        TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
        TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
        TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
        TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
        TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
        TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
        TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
        TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
        TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
        TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
        TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
        TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
        TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
        TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
        TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
        TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
        TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
        TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
        TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
        TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
        TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
        TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
        TestSuite_Add(suite,"/bson/json/read/regex_options_order",
                      test_bson_json_read_regex_options_order);
        TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
        TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
        TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
        TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
        TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
        TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
        TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
        TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
        TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
        TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
        TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
        TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
        TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
        TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
        TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
        TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
        TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
        TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
        TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
        TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
        TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
        TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
        TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
        TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
        TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
        TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
        return;
      }
LAB_0012ac9f:
      apcStack_588[0] = (code *)0x12aca7;
      cVar1 = bson_iter_next(auStack_500);
      if (cVar1 != '\0') {
        if (uStack_4d8 < 0x200) {
          apcStack_588[0] = (code *)0x12acc8;
          uVar3 = bson_iter_type(auStack_500);
          if (uVar3 < 0x14) break;
          goto LAB_0012ad71;
        }
        apcStack_588[0] = (code *)0x12adbb;
        test_bson_iter_fuzz_cold_2();
        goto LAB_0012adbb;
      }
      apcStack_588[0] = (code *)0x12ad8f;
      bson_destroy(lVar6);
    }
    apcStack_588[0] = (code *)0x12ad97;
    bson_free(puVar5);
    uVar3 = (int)puVar16 + 1;
    puVar16 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 100000) {
      return;
    }
  } while( true );
  if ((0xfff66U >> (uVar3 & 0x1f) & 1) == 0) {
    if ((0x18U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 7) {
        if (uStack_4f8 <= iStack_4f4 + 0xcU) goto LAB_0012add9;
      }
      else {
LAB_0012ad71:
        if ((uVar3 != 0x7f) && (uVar3 != 0xff)) goto LAB_0012adde;
      }
    }
    else {
      puStack_508 = (uint *)0x0;
      uStack_50c = 0;
      apcStack_588[0] = (code *)0x12ad04;
      bson_iter_document(auStack_500,&uStack_50c,&puStack_508);
      if (uStack_50c != 0) {
        if (puStack_508 == (uint *)0x0) goto LAB_0012adc0;
        if (uStack_50c < 5) goto LAB_0012adc5;
        if (*(uint *)(lVar6 + 4) <= iStack_4f4 + uStack_50c) goto LAB_0012adca;
        if (uStack_50c == 0xffffffff) goto LAB_0012adcf;
        uStack_50c = *puStack_508;
        if (uStack_50c < 5) goto LAB_0012add4;
      }
    }
  }
  goto LAB_0012ac9f;
}

Assistant:

static void
test_bson_iter_overflow (void)
{
   bson_iter_t iter;
   bson_t *b;

   b = get_bson (BINARY_DIR "/overflow1.bson");
   BSON_ASSERT (!b);

   b = get_bson (BINARY_DIR "/overflow2.bson");
   BSON_ASSERT (b);
   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (!bson_iter_next (&iter));
   bson_destroy (b);
}